

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O0

void __thiscall Memory::HeapAllocatorData::LogFree(HeapAllocatorData *this,HeapAllocRecord *record)

{
  code *pcVar1;
  bool bVar2;
  undefined8 *in_FS_OFFSET;
  HeapAllocRecord *record_local;
  HeapAllocatorData *this_local;
  
  if (record->data != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapAllocator.cpp"
                       ,0x1d8,"(record->data == this)","record->data == this");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (record->next != (HeapAllocRecord *)0x0) {
    record->next->prev = record->prev;
  }
  if (record->prev == (HeapAllocRecord *)0x0) {
    this->head = record->next;
  }
  else {
    record->prev->next = record->next;
  }
  this->deleteCount = this->deleteCount + 1;
  this->outstandingBytes = this->outstandingBytes - record->size;
  if (record->stacktrace != (StackBackTrace *)0x0) {
    StackBackTrace::Delete<Memory::NoCheckHeapAllocator>
              (record->stacktrace,(NoCheckHeapAllocator *)&NoCheckHeapAllocator::Instance);
  }
  return;
}

Assistant:

void
HeapAllocatorData::LogFree(HeapAllocRecord * record)
{
    Assert(record->data == this);

    // This is an expensive check for double free
#if 0
    HeapAllocRecord * curr = head;
    while (curr != nullptr)
    {
        if (curr == record)
        {
            break;
        }
        curr = curr->next;
    }
    Assert(curr != nullptr);
#endif
    if (record->next != nullptr)
    {
        record->next->prev = record->prev;
    }
    if (record->prev == nullptr)
    {
        head = record->next;
    }
    else
    {
        record->prev->next = record->next;
    }

    deleteCount++;
    outstandingBytes -= record->size;
#if defined(CHECK_MEMORY_LEAK) || defined(LEAK_REPORT)
#ifdef STACK_BACK_TRACE
    if (record->stacktrace != nullptr)
    {
        record->stacktrace->Delete(&NoCheckHeapAllocator::Instance);
    }
#endif
#endif
}